

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O0

void __thiscall WriteUint128_BufferTooSmall_Test::TestBody(WriteUint128_BufferTooSmall_Test *this)

{
  bool bVar1;
  char *pcVar2;
  undefined8 uVar3;
  v128 bits;
  v128 bits_00;
  AssertHelper local_140;
  Message local_138;
  char local_129;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_4;
  Message local_110;
  char local_101;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_3;
  Message local_e8;
  char local_d9;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_2;
  undefined8 local_bb;
  wabt local_b3;
  char cStack_b2;
  char cStack_b1;
  char buffer_1 [3];
  Message local_a8;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_1;
  undefined1 local_88 [8];
  string actual;
  AssertHelper local_60;
  Message local_58;
  char local_49;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  undefined8 local_30;
  wabt local_28 [8];
  char buffer [20];
  WriteUint128_BufferTooSmall_Test *this_local;
  
  uVar3 = 0xffffffff;
  unique0x10000878 = this;
  v128::v128((v128 *)&gtest_ar.message_,0xffffffff,0xffffffff,0xffffffff,0xffffffff);
  bits.v[8] = (char)uVar3;
  bits.v[9] = (char)((ulong)uVar3 >> 8);
  bits.v[10] = (char)((ulong)uVar3 >> 0x10);
  bits.v[0xb] = (char)((ulong)uVar3 >> 0x18);
  bits.v[0xc] = (char)((ulong)uVar3 >> 0x20);
  bits.v[0xd] = (char)((ulong)uVar3 >> 0x28);
  bits.v[0xe] = (char)((ulong)uVar3 >> 0x30);
  bits.v[0xf] = (char)((ulong)uVar3 >> 0x38);
  bits.v._0_8_ = local_30;
  wabt::WriteUint128(local_28,(char *)0x14,
                     (size_t)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl,bits);
  local_49 = '\0';
  testing::internal::EqHelper::Compare<char,_char,_nullptr>
            ((EqHelper *)local_48,"buffer[19]","\'\\0\'",buffer + 0xb,&local_49);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(&local_58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_48);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/test-literal.cc"
               ,0x33a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::Message::~Message(&local_58);
  }
  actual.field_2._13_3_ = 0;
  actual.field_2._M_local_buf[0xc] = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  if (actual.field_2._12_4_ == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char*,void>
              ((string *)local_88,(char *)local_28,buffer + 0xb,
               (allocator<char> *)
               ((long)&gtest_ar_1.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&gtest_ar_1.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 7));
    testing::internal::EqHelper::
    Compare<char[20],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
              ((EqHelper *)local_a0,"\"3402823669209384634\"","actual",
               (char (*) [20])"3402823669209384634",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
    if (!bVar1) {
      testing::Message::Message(&local_a8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffff50,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/test-literal.cc"
                 ,0x33c,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff50,&local_a8)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff50);
      testing::Message::~Message(&local_a8);
    }
    actual.field_2._13_3_ = 0;
    actual.field_2._M_local_buf[0xc] = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
    if (actual.field_2._12_4_ == 0) {
      actual.field_2._12_4_ = 0;
    }
    std::__cxx11::string::~string((string *)local_88);
    if (actual.field_2._12_4_ == 0) {
      uVar3 = 0;
      v128::v128((v128 *)((long)&gtest_ar_2.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         + 5),0x7b,0,0,0);
      bits_00.v[8] = (char)uVar3;
      bits_00.v[9] = (char)((ulong)uVar3 >> 8);
      bits_00.v[10] = (char)((ulong)uVar3 >> 0x10);
      bits_00.v[0xb] = (char)((ulong)uVar3 >> 0x18);
      bits_00.v[0xc] = (char)((ulong)uVar3 >> 0x20);
      bits_00.v[0xd] = (char)((ulong)uVar3 >> 0x28);
      bits_00.v[0xe] = (char)((ulong)uVar3 >> 0x30);
      bits_00.v[0xf] = (char)((ulong)uVar3 >> 0x38);
      bits_00.v._0_8_ = local_bb;
      wabt::WriteUint128(&local_b3,(char *)0x3,stack0xffffffffffffff3d,bits_00);
      local_d9 = '1';
      testing::internal::EqHelper::Compare<char,_char,_nullptr>
                ((EqHelper *)local_d8,"buffer[0]","\'1\'",(char *)&local_b3,&local_d9);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
      if (!bVar1) {
        testing::Message::Message(&local_e8);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/test-literal.cc"
                   ,0x342,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_e8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_e8);
      }
      actual.field_2._13_3_ = 0;
      actual.field_2._M_local_buf[0xc] = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
      if (actual.field_2._12_4_ == 0) {
        local_101 = '2';
        testing::internal::EqHelper::Compare<char,_char,_nullptr>
                  ((EqHelper *)local_100,"buffer[1]","\'2\'",&cStack_b2,&local_101);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
        if (!bVar1) {
          testing::Message::Message(&local_110);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/test-literal.cc"
                     ,0x343,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_4.message_,&local_110);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_110);
        }
        actual.field_2._13_3_ = 0;
        actual.field_2._M_local_buf[0xc] = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
        if (actual.field_2._12_4_ == 0) {
          local_129 = '\0';
          testing::internal::EqHelper::Compare<char,_char,_nullptr>
                    ((EqHelper *)local_128,"buffer[2]","\'\\0\'",&cStack_b1,&local_129);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
          if (!bVar1) {
            testing::Message::Message(&local_138);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
            testing::internal::AssertHelper::AssertHelper
                      (&local_140,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/test-literal.cc"
                       ,0x344,pcVar2);
            testing::internal::AssertHelper::operator=(&local_140,&local_138);
            testing::internal::AssertHelper::~AssertHelper(&local_140);
            testing::Message::~Message(&local_138);
          }
          actual.field_2._13_3_ = 0;
          actual.field_2._M_local_buf[0xc] = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
        }
      }
    }
  }
  return;
}

Assistant:

TEST(WriteUint128, BufferTooSmall) {
  {
    char buffer[20];
    WriteUint128(buffer, 20, {0xffffffff, 0xffffffff, 0xffffffff, 0xffffffff});
    ASSERT_EQ(buffer[19], '\0');
    std::string actual(buffer, buffer + 19);
    ASSERT_EQ("3402823669209384634", actual);
  }

  {
    char buffer[3];
    WriteUint128(buffer, 3, {123, 0, 0, 0});
    ASSERT_EQ(buffer[0], '1');
    ASSERT_EQ(buffer[1], '2');
    ASSERT_EQ(buffer[2], '\0');
  }
}